

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double *x_00;
  double *u_00;
  double *ret;
  void *pvVar1;
  FILE *__stream;
  FILE *__stream_00;
  double dVar2;
  double dVar3;
  int j_1;
  int j;
  int i_1;
  Cgmres<Model> controller;
  int i;
  double *pt;
  double *dxdt;
  double *u;
  double *x;
  double t_all;
  double t_end;
  double t_start;
  FILE *fp_u;
  FILE *fp_x;
  double *in_stack_000011b0;
  double *in_stack_000011b8;
  Cgmres<Model> *in_stack_000011c0;
  double *in_stack_fffffffffffffee8;
  Cgmres<Model> *in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  Cgmres<Model> *in_stack_ffffffffffffff00;
  FILE *this;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar4;
  int local_d8;
  int local_54;
  double local_30;
  
  local_30 = 0.0;
  x_00 = (double *)operator_new__(0x20);
  u_00 = (double *)operator_new__(0x30);
  ret = (double *)operator_new__(0x20);
  pvVar1 = operator_new__(0x330);
  *x_00 = 2.0;
  x_00[1] = 2.0;
  x_00[2] = 0.0;
  x_00[3] = 0.0;
  *u_00 = 0.0;
  u_00[1] = 0.0;
  u_00[2] = 10.0;
  u_00[3] = 10.0;
  u_00[4] = 0.0005;
  u_00[5] = 0.0005;
  *ret = 0.0;
  ret[1] = 0.0;
  ret[2] = 0.0;
  ret[3] = 0.0;
  for (local_54 = 0; local_54 < 0x33; local_54 = local_54 + 1) {
    *(undefined8 *)((long)pvVar1 + (long)(local_54 << 1) * 8) = 0x3ff0000000000000;
    *(undefined8 *)((long)pvVar1 + (long)(local_54 * 2 + 1) * 8) = 0xbff0000000000000;
  }
  Cgmres<Model>::Cgmres
            ((Cgmres<Model> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  Cgmres<Model>::set_ptau(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Cgmres<Model>::init_u0(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Cgmres<Model>::init_u0_newton
            ((Cgmres<Model> *)controller.super_Gmres.g_vec,controller.super_Gmres.rho_e_vec,
             controller.super_Gmres.h_mat,controller.super_Gmres.v_mat,
             controller.super_Gmres.tol._6_2_);
  __stream = fopen("mass_spring_damper_x.txt","w");
  this = __stream;
  __stream_00 = fopen("mass_spring_damper_u.txt","w");
  if ((__stream != (FILE *)0x0) && (__stream_00 != (FILE *)0x0)) {
    for (local_d8 = 0; local_d8 < 0x4e21; local_d8 = local_d8 + 1) {
      dVar2 = getEtime();
      Cgmres<Model>::control(in_stack_000011c0,in_stack_000011b8,in_stack_000011b0);
      dVar3 = getEtime();
      local_30 = local_30 + (dVar3 - dVar2);
      Simulator::dxdt(ret,x_00,u_00);
      mul(ret,ret,0.001,4);
      add(x_00,x_00,ret,4);
      fprintf(__stream,"%f",(double)local_d8 * 0.001);
      fprintf(__stream_00,"%f",(double)local_d8 * 0.001);
      for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
        fprintf(__stream,"\t%f",x_00[iVar4]);
      }
      for (iVar4 = 0; iVar4 < 6; iVar4 = iVar4 + 1) {
        fprintf(__stream_00,"\t%f",u_00[iVar4]);
      }
      fprintf(__stream,"\n");
      fprintf(__stream_00,"\n");
    }
    fclose(__stream);
    fclose(__stream_00);
    printf("Elapsed time = %f\n",local_30);
  }
  if (x_00 != (double *)0x0) {
    operator_delete__(x_00);
  }
  if (u_00 != (double *)0x0) {
    operator_delete__(u_00);
  }
  if (ret != (double *)0x0) {
    operator_delete__(ret);
  }
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  Cgmres<Model>::~Cgmres((Cgmres<Model> *)this);
  return 0;
}

Assistant:

int main(void) {
  //---------------------------
  FILE* fp_x;
  FILE* fp_u;

  double t_start, t_end, t_all = 0;

  double* x;
  double* u;
  double* dxdt;
  double* pt;

  x = new double[Simulator::dim_x];
  u = new double[Simulator::dim_u];
  dxdt = new double[Simulator::dim_x];
  pt = new double[Simulator::dim_p * (Simulator::dv + 1)];

  // mass_spring_damper
  x[0] = 2.0;
  x[1] = 2.0;
  x[2] = 0.0;
  x[3] = 0.0;

  u[0] = 0.0;
  u[1] = 0.0;
  u[2] = 10.0;
  u[3] = 10.0;
  u[4] = 5e-4;
  u[5] = 5e-4;

  dxdt[0] = 0.0;
  dxdt[1] = 0.0;
  dxdt[2] = 0.0;
  dxdt[3] = 0.0;

  for (int i = 0; i < Simulator::dv + 1; i++) {
    pt[Simulator::dim_p * i + 0] = 1;
    pt[Simulator::dim_p * i + 1] = -1;
  }

  Cgmres<Model> controller;
  controller.set_ptau(pt);
  controller.init_u0(u);
  controller.init_u0_newton(u, x, pt, 10);

  fp_x = fopen("mass_spring_damper_x.txt", "w");
  fp_u = fopen("mass_spring_damper_u.txt", "w");

  if (NULL != fp_x && NULL != fp_u) {
    for (int i = 0; i <= (int)(Simulator::t_end / Simulator::dt); i++) {
      // Test code
      t_start = getEtime();
      controller.control(u, x);
      t_end = getEtime();
      t_all += (t_end - t_start);

      // x = x + dxdt * dt
      Simulator::dxdt(dxdt, x, u);
      mul(dxdt, dxdt, Simulator::dt, Simulator::dim_x);
      add(x, x, dxdt, Simulator::dim_x);

      fprintf(fp_x, "%f", Simulator::dt * i);
      fprintf(fp_u, "%f", Simulator::dt * i);
      for (int j = 0; j < Simulator::dim_x; j++) {
        fprintf(fp_x, "\t%f", x[j]);
      }
      for (int j = 0; j < Simulator::dim_u; j++) {
        fprintf(fp_u, "\t%f", u[j]);
      }
      fprintf(fp_x, "\n");
      fprintf(fp_u, "\n");
    }

    fclose(fp_x);
    fclose(fp_u);

    printf("Elapsed time = %f\n", t_all);
  }

  delete[] x;
  delete[] u;
  delete[] dxdt;
  delete[] pt;

  return 0;
}